

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::js::Generator::GenerateClassSerializeBinaryField
          (Generator *this,GeneratorOptions *options,Printer *printer,FieldDescriptor *field)

{
  bool bVar1;
  CppType CVar2;
  Type TVar3;
  FieldDescriptor *this_00;
  FieldDescriptor *this_01;
  GeneratorOptions *options_00;
  string *psVar4;
  int i;
  int i_00;
  FieldDescriptor *field_00;
  GeneratorOptions *options_01;
  GeneratorOptions *options_02;
  char *pcVar5;
  BytesMode in_R8D;
  undefined1 in_R9B;
  BytesMode in_stack_ffffffffffffff70;
  string typed_annotation;
  string local_68;
  string local_48;
  
  bVar1 = anon_unknown_0::HasFieldPresence((GeneratorOptions *)field,(FieldDescriptor *)options);
  if (bVar1) {
    CVar2 = FieldDescriptor::cpp_type(field);
    if (CVar2 == CPPTYPE_MESSAGE) goto LAB_00259267;
    (anonymous_namespace)::JSFieldTypeAnnotation_abi_cxx11_
              (&typed_annotation,(_anonymous_namespace_ *)options,(GeneratorOptions *)field,
               (FieldDescriptor *)0x0,false,false,false,in_stack_ffffffffffffff70);
    (anonymous_namespace)::JSFieldIndex_abi_cxx11_
              (&local_68,(_anonymous_namespace_ *)field,field_00);
    pcVar5 = "  f = /** @type {$type$} */ (jspb.Message.getField(message, $index$));\n";
    psVar4 = &local_68;
    io::Printer::Print(printer,
                       "  f = /** @type {$type$} */ (jspb.Message.getField(message, $index$));\n",
                       "index",psVar4,"type",&typed_annotation);
  }
  else {
LAB_00259267:
    (anonymous_namespace)::JSGetterName_abi_cxx11_
              (&typed_annotation,(_anonymous_namespace_ *)field,(GeneratorOptions *)0x2,
               (FieldDescriptor *)0x0,in_R8D,(bool)in_R9B);
    bVar1 = FieldDescriptor::is_map(field);
    pcVar5 = "";
    if (bVar1) {
      pcVar5 = "true";
    }
    std::__cxx11::string::string((string *)&local_68,pcVar5,(allocator *)&local_48);
    pcVar5 = "  f = message.get$name$($nolazy$);\n";
    psVar4 = &typed_annotation;
    io::Printer::Print(printer,"  f = message.get$name$($nolazy$);\n","name",psVar4,"nolazy",
                       &local_68);
  }
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&typed_annotation);
  bVar1 = FieldDescriptor::is_map(field);
  if (bVar1) {
    pcVar5 = "  if (f && f.getLength() > 0) {\n";
  }
  else if (*(int *)(field + 0x4c) == 3) {
    pcVar5 = "  if (f.length > 0) {\n";
  }
  else {
    bVar1 = anon_unknown_0::HasFieldPresence((GeneratorOptions *)field,(FieldDescriptor *)pcVar5);
    if (bVar1) {
      pcVar5 = "  if (f != null) {\n";
    }
    else {
      CVar2 = FieldDescriptor::cpp_type(field);
      if (8 < CVar2 - CPPTYPE_INT32) {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/js/js_generator.cc"
                      ,0xbbe,
                      "void google::protobuf::compiler::js::Generator::GenerateClassSerializeBinaryField(const GeneratorOptions &, io::Printer *, const FieldDescriptor *) const"
                     );
      }
      psVar4 = (string *)&DAT_003474cc;
      pcVar5 = &DAT_003474cc + *(int *)(&DAT_003474cc + (ulong)(CVar2 - CPPTYPE_INT32) * 4);
    }
  }
  io::Printer::Print(printer,pcVar5);
  bVar1 = FieldDescriptor::is_map(field);
  if (bVar1) {
    this_00 = anon_unknown_0::MapFieldKey(field);
    this_01 = anon_unknown_0::MapFieldValue(field);
    SimpleItoa_abi_cxx11_(&typed_annotation,(protobuf *)(ulong)*(uint *)(field + 0x38),i);
    (anonymous_namespace)::JSBinaryWriterMethodName_abi_cxx11_
              (&local_68,(_anonymous_namespace_ *)this_00,options_01,(FieldDescriptor *)psVar4);
    (anonymous_namespace)::JSBinaryWriterMethodName_abi_cxx11_
              (&local_48,(_anonymous_namespace_ *)this_01,options_02,(FieldDescriptor *)psVar4);
    psVar4 = &typed_annotation;
    io::Printer::Print(printer,
                       "    f.serializeBinary($index$, writer, $keyWriterFn$, $valueWriterFn$",
                       "index",psVar4,"keyWriterFn",&local_68,"valueWriterFn",&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&typed_annotation);
    TVar3 = FieldDescriptor::type(this_01);
    pcVar5 = ");\n";
    if (TVar3 == TYPE_MESSAGE) {
      options_00 = (GeneratorOptions *)FieldDescriptor::message_type(this_01);
      (anonymous_namespace)::GetMessagePath_abi_cxx11_
                (&typed_annotation,(_anonymous_namespace_ *)options,options_00,(Descriptor *)psVar4)
      ;
      io::Printer::Print(printer,", $messageType$.serializeBinaryToWriter","messageType",
                         &typed_annotation);
      std::__cxx11::string::~string((string *)&typed_annotation);
    }
    goto LAB_00259557;
  }
  (anonymous_namespace)::JSBinaryReadWriteMethodName_abi_cxx11_
            (&typed_annotation,(_anonymous_namespace_ *)field,(FieldDescriptor *)0x1,SUB81(psVar4,0)
            );
  SimpleItoa_abi_cxx11_(&local_68,(protobuf *)(ulong)*(uint *)(field + 0x38),i_00);
  psVar4 = &typed_annotation;
  io::Printer::Print(printer,"    writer.write$method$(\n      $index$,\n      f","method",psVar4,
                     "index",&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&typed_annotation);
  CVar2 = FieldDescriptor::cpp_type(field);
  if (CVar2 == CPPTYPE_MESSAGE) {
    bVar1 = FieldDescriptor::is_map(field);
    if (bVar1) goto LAB_00259509;
    (anonymous_namespace)::SubmessageTypeRef_abi_cxx11_
              (&typed_annotation,(_anonymous_namespace_ *)options,(GeneratorOptions *)field,
               (FieldDescriptor *)psVar4);
    io::Printer::Print(printer,",\n      $submsg$.serializeBinaryToWriter\n","submsg",
                       &typed_annotation);
    std::__cxx11::string::~string((string *)&typed_annotation);
  }
  else {
LAB_00259509:
    io::Printer::Print(printer,"\n");
  }
  pcVar5 = "    );\n";
LAB_00259557:
  io::Printer::Print(printer,pcVar5);
  io::Printer::Print(printer,"  }\n");
  return;
}

Assistant:

void Generator::GenerateClassSerializeBinaryField(
    const GeneratorOptions& options,
    io::Printer* printer,
    const FieldDescriptor* field) const {
  if (HasFieldPresence(options, field) &&
      field->cpp_type() != FieldDescriptor::CPPTYPE_MESSAGE) {
    string typed_annotation = JSFieldTypeAnnotation(
        options, field,
        /* is_setter_argument = */ false,
        /* force_present = */ false,
        /* singular_if_not_packed = */ false,
        /* bytes_mode = */ BYTES_DEFAULT);
    printer->Print(
        "  f = /** @type {$type$} */ "
        "(jspb.Message.getField(message, $index$));\n",
        "index", JSFieldIndex(field),
        "type", typed_annotation);
  } else {
    printer->Print(
        "  f = message.get$name$($nolazy$);\n",
        "name", JSGetterName(options, field, BYTES_U8),
        // No lazy creation for maps containers -- fastpath the empty case.
        "nolazy", IsMap(options, field) ? "true" : "");
  }

  // Print an `if (condition)` statement that evaluates to true if the field
  // goes on the wire.
  if (IsMap(options, field)) {
    printer->Print(
        "  if (f && f.getLength() > 0) {\n");
  } else if (field->is_repeated()) {
    printer->Print(
        "  if (f.length > 0) {\n");
  } else {
    if (HasFieldPresence(options, field)) {
      printer->Print(
          "  if (f != null) {\n");
    } else {
      // No field presence: serialize onto the wire only if value is
      // non-default.  Defaults are documented here:
      // https://goto.google.com/lhdfm
      switch (field->cpp_type()) {
        case FieldDescriptor::CPPTYPE_INT32:
        case FieldDescriptor::CPPTYPE_INT64:
        case FieldDescriptor::CPPTYPE_UINT32:
        case FieldDescriptor::CPPTYPE_UINT64: {
          {
            printer->Print("  if (f !== 0) {\n");
          }
          break;
        }

        case FieldDescriptor::CPPTYPE_ENUM:
        case FieldDescriptor::CPPTYPE_FLOAT:
        case FieldDescriptor::CPPTYPE_DOUBLE:
          printer->Print(
              "  if (f !== 0.0) {\n");
          break;
        case FieldDescriptor::CPPTYPE_BOOL:
          printer->Print(
              "  if (f) {\n");
          break;
        case FieldDescriptor::CPPTYPE_STRING:
          printer->Print(
              "  if (f.length > 0) {\n");
          break;
        default:
          assert(false);
          break;
      }
    }
  }

  // Write the field on the wire.
  if (IsMap(options, field)) {
    const FieldDescriptor* key_field = MapFieldKey(field);
    const FieldDescriptor* value_field = MapFieldValue(field);
    printer->Print(
        "    f.serializeBinary($index$, writer, "
                              "$keyWriterFn$, $valueWriterFn$",
        "index", SimpleItoa(field->number()),
        "keyWriterFn", JSBinaryWriterMethodName(options, key_field),
        "valueWriterFn", JSBinaryWriterMethodName(options, value_field));

    if (value_field->type() == FieldDescriptor::TYPE_MESSAGE) {
      printer->Print(", $messageType$.serializeBinaryToWriter",
          "messageType", GetMessagePath(options, value_field->message_type()));
    }

    printer->Print(");\n");
  } else {
    printer->Print(
        "    writer.write$method$(\n"
        "      $index$,\n"
        "      f",
        "method", JSBinaryReadWriteMethodName(field, /* is_writer = */ true),
        "index", SimpleItoa(field->number()));

    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE &&
        !IsMap(options, field)) {
      printer->Print(
          ",\n"
          "      $submsg$.serializeBinaryToWriter\n",
        "submsg", SubmessageTypeRef(options, field));
    } else {
      printer->Print("\n");
    }

    printer->Print(
        "    );\n");
  }

  // Close the `if`.
  printer->Print(
      "  }\n");
}